

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

void Abc_NtkDelayTracePrint(Abc_Ntk_t *pNtk,int fUseLutLib,int fVerbose)

{
  int *piVar1;
  void **ppvVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (fUseLutLib == 0) {
    iVar6 = Abc_NtkLevel(pNtk);
    fVar15 = (float)iVar6;
  }
  else {
    pvVar7 = Abc_FrameReadLibLut();
    fVar15 = 20.0;
    if (pvVar7 != (void *)0x0) {
      iVar6 = *(int *)((long)pvVar7 + 8);
      iVar4 = Abc_NtkGetFaninMax(pNtk);
      fVar15 = 20.0;
      if (iVar6 < iVar4) {
        uVar11 = *(uint *)((long)pvVar7 + 8);
        uVar5 = Abc_NtkGetFaninMax(pNtk);
        printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar11,
               (ulong)uVar5);
        return;
      }
    }
  }
  fVar14 = (fVar15 + 1.0) * 4.0;
  uVar8 = (ulong)fVar14;
  pvVar7 = calloc(1,(long)(fVar14 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8);
  fVar14 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  lVar9 = (long)pNtk->vObjs->nSize;
  if (0 < lVar9) {
    ppvVar2 = pNtk->vObjs->pArray;
    lVar10 = 0;
    do {
      plVar3 = (long *)ppvVar2[lVar10];
      if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
         (*(int *)((long)plVar3 + 0x1c) != 0)) {
        fVar16 = *(float *)(*(long *)(*plVar3 + 400) + 8 + (long)(int)plVar3[2] * 0xc) /
                 (fVar14 / fVar15);
        if ((fVar16 < 0.0) || (fVar15 < fVar16)) {
          __assert_fail("Num >=0 && Num <= nSteps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSpeedup.c"
                        ,0x10f,"void Abc_NtkDelayTracePrint(Abc_Ntk_t *, int, int)");
        }
        piVar1 = (int *)((long)pvVar7 + (long)(int)fVar16 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  pcVar12 = "LUT library";
  if (fUseLutLib == 0) {
    pcVar12 = "unit-delay";
  }
  printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar14,pcVar12);
  if (fVar15 <= 0.0) {
    if (pvVar7 == (void *)0x0) {
      return;
    }
  }
  else {
    pcVar12 = "%";
    if (fUseLutLib == 0) {
      pcVar12 = "lev";
    }
    uVar8 = 0;
    uVar11 = 5;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(int *)((long)pvVar7 + uVar8 * 4);
      uVar8 = uVar8 + 1;
      uVar13 = (ulong)uVar11;
      if (fUseLutLib == 0) {
        uVar13 = uVar8 & 0xffffffff;
      }
      printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)uVar5 * 100.0) / (double)pNtk->nObjCounts[7]
             ,uVar13,pcVar12,(ulong)uVar5);
      uVar11 = uVar11 + 5;
    } while ((float)(int)uVar8 < fVar15);
  }
  free(pvVar7);
  return;
}

Assistant:

void Abc_NtkDelayTracePrint( Abc_Ntk_t * pNtk, int fUseLutLib, int fVerbose )
{
    Abc_Obj_t * pNode;
    If_LibLut_t * pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = fUseLutLib ? 20 : Abc_NtkLevel(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Abc_ObjSlack(pNode) / tDelta;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, fUseLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", fUseLutLib? 5*(i+1) : i+1, 
            fUseLutLib? "%":"lev", Nodes, 100.0*Nodes/Abc_NtkNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}